

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,size_t maxSize)

{
  iterator __position;
  ulong uVar1;
  element_t value;
  double local_28;
  
  this->max_size__ = maxSize;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  local_28 = 0.0;
  if (this->max_size__ != 0) {
    uVar1 = 0;
    do {
      __position._M_current =
           (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->container__,__position,&local_28)
        ;
      }
      else {
        *__position._M_current = local_28;
        (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->max_size__);
  }
  return;
}

Assistant:

vector(size_t maxSize) : max_size__(maxSize) {
          element_t value = 0;
          for(size_t i=0; i<max_size__; i++) container__.push_back(value);
      }